

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

entry * __thiscall
libtorrent::create_torrent::generate(entry *__return_storage_ptr__,create_torrent *this)

{
  integer_type iVar1;
  string_view key;
  undefined8 this_00;
  reference pvVar2;
  dictionary_type *this_01;
  bool bVar3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar4;
  data_type dVar5;
  const_reference pvVar6;
  entry *peVar7;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar8;
  size_type sVar9;
  ulong uVar10;
  const_reference pvVar11;
  reference __args;
  value_type *c_00;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *pvVar12;
  mapped_type *this_02;
  string_type *psVar13;
  const_reference c_01;
  list_type *plVar14;
  reference pvVar15;
  value_type *pvVar16;
  value_type *pvVar17;
  key_type *k;
  tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
  *this_03;
  entry *peVar18;
  value_type *pvVar19;
  reference this_04;
  char *pcVar20;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *in_RCX;
  undefined7 uVar21;
  int iVar22;
  sha256_hash *in_R8;
  undefined1 auVar23 [16];
  span<const_libtorrent::digest32<256L>_> leaves;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  string_view p_03;
  string_view p_04;
  string_view p_05;
  bool local_ca9;
  bool local_bd9;
  bool local_bc1;
  bool local_b01;
  sha1_hash *h;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<sha1_hash,_piece_index_t> *__range2_6;
  string_type *local_900;
  string *p_2;
  string_view local_8e8;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_8d4;
  string_view local_8d0;
  int local_8bc;
  string_view local_8b8;
  int local_8a4;
  span<const_char> local_8a0;
  int local_890;
  int local_88c;
  string local_888;
  uchar local_864;
  uchar local_863;
  bitfield_flag local_862;
  uchar local_861;
  string_view local_860;
  int local_850;
  int local_84c;
  string_view local_848;
  entry *local_838;
  entry *file_e_1;
  char *local_828;
  size_t sStack_820;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_810;
  error_code_enum local_7ec;
  undefined1 local_7e8 [40];
  tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
  local_7c0;
  size_t sStack_7a0;
  undefined1 auStack_790 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  e;
  undefined1 local_760 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split;
  undefined1 local_738 [8];
  string file_path;
  entry *file_e_ptr;
  file_flags_t local_705;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_704;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  iStack_700;
  file_flags_t flags_2;
  file_index_t i_1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_6f4
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2_5;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  __begin2_5;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2_5;
  entry *local_6d0;
  entry *tree;
  string_view local_6c0;
  int local_6ac;
  span<const_char> local_6a8;
  digest32<160L> local_694;
  int local_680;
  int local_67c;
  string local_678;
  uchar local_654;
  uchar local_653;
  bitfield_flag local_652;
  uchar local_651;
  int local_650;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_649;
  char *pcStack_648;
  file_flags_t flags_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_638;
  libtorrent *local_618;
  char *pcStack_610;
  undefined1 local_608 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  elems;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_5d8;
  libtorrent *plStack_5b8;
  string_view path;
  string local_5a0 [8];
  string p_1;
  entry *path_e;
  int local_554;
  string_view local_550;
  int local_540;
  int local_53c;
  reference local_538;
  entry *file_e;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_528;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_51c
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end3_2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  __begin3_2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range3_2;
  entry *local_4f8;
  entry *files;
  span<const_char> local_4e0;
  string local_4d0;
  uchar local_4ad;
  uchar local_4ac;
  bitfield_flag local_4ab;
  uchar local_4aa;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_4a9;
  undefined1 auStack_4a8 [7];
  file_flags_t flags;
  string_view local_498;
  const_reference local_488;
  value_type *file;
  string_view local_470;
  string_type local_460;
  string_view local_440;
  string_type local_430;
  digest32<160L> *local_410;
  digest32<160L> *ih;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *__range2_4;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_3e0;
  entry *list_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_3a8;
  entry *list_1;
  string_view local_398;
  entry *local_388;
  entry *info;
  reference local_378;
  digest32<256L> *p;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  value_type *__range3_1;
  string local_348;
  string_type *local_328;
  string_type *pieces;
  int local_318;
  int local_314;
  libtorrent *local_310;
  digest32<256L> *local_308;
  sha256_hash local_2fc;
  int local_2dc;
  uchar local_2d5;
  int local_2d4;
  uchar local_2ce;
  bitfield_flag local_2cd;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_2cc;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_2c8;
  file_index_t fi;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_2bc
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2_2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  __begin2_2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2_2;
  dictionary_type *local_298;
  dictionary_type *file_pieces;
  sha256_hash pad_hash;
  vector<sha256_hash,_file_index_t> fileroots;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_228;
  entry *list;
  string_type local_210;
  string_view local_1f0;
  string_type local_1e0;
  string_view local_1c0;
  string_view local_1b0;
  string_type local_1a0;
  string_view local_180;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> local_170;
  reference local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *url;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  undefined1 local_130 [4];
  int current_tier;
  list_type tier;
  list_type trackers;
  allocator<libtorrent::entry> local_d9;
  undefined1 local_d8 [8];
  list_type node;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  list_type *nodes_list;
  entry *local_88;
  entry *nodes;
  string_type local_70;
  byte local_49;
  error_code_enum local_48 [4];
  container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  local_38;
  byte local_1e;
  byte local_1d;
  error_code_enum local_1c;
  bool make_v1;
  bool make_v2;
  create_torrent *pcStack_18;
  create_torrent *this_local;
  entry *dict;
  
  pcStack_18 = this;
  this_local = (create_torrent *)__return_storage_ptr__;
  bVar3 = ::std::
          vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
          empty((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 *)this);
  if ((bVar3) || (this->m_total_size == 0)) {
    local_1c = torrent_missing_file_tree;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_1c);
  }
  local_1d = anon_unknown_40::validate_v2_hashes
                       (&this->m_files,&this->m_file_piece_hash,this->m_piece_length);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::container_wrapper(&local_38,&this->m_piece_hash);
  bVar3 = anon_unknown_40::validate_v1_hashes(&local_38,this->m_total_size,this->m_piece_length);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::~container_wrapper(&local_38);
  local_1e = bVar3;
  if ((!bVar3) && ((local_1d & 1) == 0)) {
    local_48[0] = invalid_hash_entry;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (local_48);
  }
  local_49 = 0;
  entry::entry(__return_storage_ptr__);
  bVar3 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::empty(&this->m_urls);
  if (!bVar3) {
    pvVar6 = ::std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::front(&this->m_urls);
    ::std::__cxx11::string::string((string *)&local_70,(string *)pvVar6);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&nodes,"announce");
    peVar7 = entry::operator[](__return_storage_ptr__,_nodes);
    entry::operator=(peVar7,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  bVar3 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::empty(&this->m_nodes);
  if (!bVar3) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&nodes_list,"nodes");
    local_88 = entry::operator[](__return_storage_ptr__,_nodes_list);
    pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(local_88);
    in_RCX = pvVar8;
    __end2 = ::std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(&this->m_nodes);
    n = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->m_nodes);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                                       *)&n), bVar3) {
      node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                    ::operator*(&__end2);
      ::std::allocator<libtorrent::entry>::allocator(&local_d9);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_d8,2,
                 &local_d9);
      ::std::allocator<libtorrent::entry>::~allocator(&local_d9);
      ::std::__cxx11::string::string
                ((string *)
                 &trackers.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)
                 node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar15 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_d8
                           ,0);
      entry::operator=(pvVar15,(string_type *)
                               &trackers.
                                super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &trackers.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar22 = *(int *)((long)&((node.
                                 super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super_variant_type).
                               super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                               .
                               super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                               .
                               super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                               .
                               super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                               .
                               super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                               .
                               super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                       + 0x20);
      pvVar15 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_d8
                           ,1);
      entry::operator=(pvVar15,(long)iVar22);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                (pvVar8,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_d8);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_d8);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&__end2);
    }
  }
  sVar9 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(&this->m_urls);
  if (1 < sVar9) {
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
               &tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_130);
    pvVar6 = ::std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::front(&this->m_urls);
    __range2_1._4_4_ = pvVar6->second;
    in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)(ulong)__range2_1._4_4_;
    __end2_1 = ::std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::begin(&this->m_urls);
    url = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *)::std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->m_urls);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                               *)&url), bVar3) {
      local_158 = __gnu_cxx::
                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                  ::operator*(&__end2_1);
      if (local_158->second != __range2_1._4_4_) {
        __range2_1._4_4_ = local_158->second;
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                   &tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_130);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::clear
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_130);
      }
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_130,
                 &local_158->first);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&__end2_1);
    }
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               &tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_130);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
              (&local_170,
               (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
               &tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_180,"announce-list");
    peVar7 = entry::operator[](__return_storage_ptr__,local_180);
    entry::operator=(peVar7,&local_170);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&local_170);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_130);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
               &tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  uVar10 = ::std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_1a0,(string *)&this->m_comment);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"comment")
    ;
    peVar7 = entry::operator[](__return_storage_ptr__,local_1b0);
    entry::operator=(peVar7,&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1a0);
  }
  if (this->m_creation_date != 0) {
    iVar1 = this->m_creation_date;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1c0,"creation date");
    peVar7 = entry::operator[](__return_storage_ptr__,local_1c0);
    entry::operator=(peVar7,iVar1);
  }
  uVar10 = ::std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_1e0,(string *)&this->m_created_by);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,"created by");
    peVar7 = entry::operator[](__return_storage_ptr__,local_1f0);
    entry::operator=(peVar7,&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  bVar3 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_url_seeds);
  if (!bVar3) {
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_url_seeds);
    if (sVar9 == 1) {
      pvVar11 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front(&this->m_url_seeds);
      ::std::__cxx11::string::string((string *)&local_210,(string *)pvVar11);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&list,"url-list");
      peVar7 = entry::operator[](__return_storage_ptr__,_list);
      entry::operator=(peVar7,&local_210);
      ::std::__cxx11::string::~string((string *)&local_210);
    }
    else {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"url-list");
      in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               entry::operator[](__return_storage_ptr__,___range3);
      local_228 = in_RCX;
      __end3 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->m_url_seeds);
      url_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->m_url_seeds);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&url_1), bVar3) {
        __args = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 entry::list((entry *)local_228);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar8,__args);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::container_wrapper((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                       *)(pad_hash.m_number._M_elems + 6));
  if ((local_1d & 1) != 0) {
    sVar9 = ::std::
            vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
            size((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  *)this);
    libtorrent::aux::
    container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::resize((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
              *)(pad_hash.m_number._M_elems + 6),sVar9);
    iVar22 = this->m_piece_length;
    if (iVar22 < 0) {
      iVar22 = iVar22 + 0x3fff;
    }
    merkle_pad((sha256_hash *)&file_pieces,iVar22 >> 0xe,1);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_2,"piece layers");
    peVar7 = entry::operator[](__return_storage_ptr__,___range2_2);
    local_298 = entry::dict_abi_cxx11_(peVar7);
    ___end2_2 = file_range(this);
    local_2bc = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         *)&__end2_2);
    iVar4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   *)&__end2_2);
    while( true ) {
      fi.m_val = (int)local_2bc.m_idx.m_val;
      local_2c8 = iVar4.m_idx.m_val;
      bVar3 = libtorrent::operator!=(local_2bc,iVar4);
      if (!bVar3) break;
      local_2d4 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                       ::operator*(&local_2bc);
      local_2cc = (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_2d4;
      pvVar17 = libtorrent::aux::
                container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                ::operator[](&this->m_files,
                             (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_2d4);
      local_2ce = (pvVar17->flags).m_val;
      local_2d5 = '\x01';
      local_2cd = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                             local_2ce,
                             (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x01')
      ;
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_2cd);
      if (!bVar3) {
        local_2dc = local_2cc.m_val;
        pvVar17 = libtorrent::aux::
                  container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                  ::operator[](&this->m_files,local_2cc);
        if (pvVar17->size != 0) {
          local_314 = local_2cc.m_val;
          c_00 = libtorrent::aux::
                 container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
                 ::operator[](&this->m_file_piece_hash,local_2cc);
          span<libtorrent::digest32<256l>const>::
          span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,void>,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_310,c_00);
          in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)&file_pieces;
          leaves.m_len = (difference_type)in_RCX;
          leaves.m_ptr = local_308;
          merkle_root(&local_2fc,local_310,leaves,in_R8);
          local_318 = local_2cc.m_val;
          pvVar19 = libtorrent::aux::
                    container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                    ::operator[]((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                  *)(pad_hash.m_number._M_elems + 6),local_2cc);
          *(undefined8 *)((pvVar19->m_number)._M_elems + 4) = local_2fc.m_number._M_elems._16_8_;
          *(undefined8 *)((pvVar19->m_number)._M_elems + 6) = local_2fc.m_number._M_elems._24_8_;
          *(undefined8 *)(pvVar19->m_number)._M_elems = local_2fc.m_number._M_elems._0_8_;
          *(undefined8 *)((pvVar19->m_number)._M_elems + 2) = local_2fc.m_number._M_elems._8_8_;
          pieces._4_4_ = local_2cc.m_val;
          pvVar12 = &libtorrent::aux::
                     container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
                     ::operator[](&this->m_file_piece_hash,local_2cc)->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ;
          sVar9 = ::std::
                  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                  size(pvVar12);
          this_01 = local_298;
          if (1 < sVar9) {
            pvVar19 = libtorrent::aux::
                      container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                      ::operator[]((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                    *)(pad_hash.m_number._M_elems + 6),local_2cc);
            digest32<256l>::to_string_abi_cxx11_(&local_348,pvVar19);
            this_02 = boost::container::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
                      ::operator[](this_01,&local_348);
            psVar13 = entry::string_abi_cxx11_(this_02);
            ::std::__cxx11::string::~string((string *)&local_348);
            local_328 = psVar13;
            ::std::__cxx11::string::clear();
            psVar13 = local_328;
            pvVar12 = &libtorrent::aux::
                       container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
                       ::operator[](&this->m_file_piece_hash,local_2cc)->
                       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ;
            ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::size(pvVar12);
            digest32<256L>::size();
            ::std::__cxx11::string::reserve((ulong)psVar13);
            pvVar12 = &libtorrent::aux::
                       container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
                       ::operator[](&this->m_file_piece_hash,local_2cc)->
                       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ;
            __end3_1 = ::std::
                       vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ::begin(pvVar12);
            p = (digest32<256L> *)
                ::std::
                vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                end(pvVar12);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                       *)&p), bVar3) {
              local_378 = __gnu_cxx::
                          __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                          ::operator*(&__end3_1);
              psVar13 = local_328;
              pcVar20 = digest32<256L>::data(local_378);
              digest32<256L>::size();
              ::std::__cxx11::string::append((char *)psVar13,(ulong)pcVar20);
              __gnu_cxx::
              __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
              ::operator++(&__end3_1);
            }
          }
        }
      }
      info._4_4_ = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   ::operator++(&local_2bc);
    }
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_398,"info");
  local_388 = entry::operator[](__return_storage_ptr__,local_398);
  dVar5 = entry::type(&this->m_info_dict);
  if ((dVar5 == dictionary_t) || (dVar5 = entry::type(&this->m_info_dict), dVar5 == preformatted_t))
  {
    entry::operator=(local_388,&this->m_info_dict);
  }
  else {
    bVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->m_collections);
    peVar7 = local_388;
    if (!bVar3) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_3,"collections");
      in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               entry::operator[](peVar7,___range2_3);
      local_3a8 = in_RCX;
      __end2_3 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->m_collections);
      c = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->m_collections);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&c), bVar3) {
        list_2 = (entry *)__gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end2_3);
        pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 entry::list((entry *)local_3a8);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>
                  (pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          list_2);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_3);
      }
    }
    bVar3 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::empty(&this->m_similar);
    peVar7 = local_388;
    if (!bVar3) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_4,"similar");
      in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               entry::operator[](peVar7,___range2_4);
      local_3e0 = in_RCX;
      __end2_4 = ::std::
                 vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                 begin(&this->m_similar);
      ih = (digest32<160L> *)
           ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
           end(&this->m_similar);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_4,
                                (__normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                                 *)&ih), bVar3) {
        local_410 = __gnu_cxx::
                    __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                    ::operator*(&__end2_4);
        pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 entry::list((entry *)local_3e0);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<libtorrent::digest32<160l>const&>(pvVar8,local_410);
        __gnu_cxx::
        __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
        ::operator++(&__end2_4);
      }
    }
    ::std::__cxx11::string::string((string *)&local_430,(string *)&this->m_name);
    peVar7 = local_388;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440,"name");
    peVar7 = entry::operator[](peVar7,local_440);
    entry::operator=(peVar7,&local_430);
    ::std::__cxx11::string::~string((string *)&local_430);
    uVar10 = ::std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      ::std::__cxx11::string::string((string *)&local_460,(string *)&this->m_root_cert);
      peVar7 = local_388;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_470,"ssl-cert");
      peVar7 = entry::operator[](peVar7,local_470);
      entry::operator=(peVar7,&local_460);
      ::std::__cxx11::string::~string((string *)&local_460);
    }
    peVar7 = local_388;
    if (((byte)this->field_0x258 >> 1 & 1) != 0) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&file,"private");
      peVar7 = entry::operator[](peVar7,_file);
      entry::operator=(peVar7,1);
    }
    peVar7 = local_388;
    if ((local_1e & 1) != 0) {
      if ((this->field_0x258 & 1) == 0) {
        local_488 = ::std::
                    vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ::front((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                             *)this);
        peVar7 = local_388;
        if ((((byte)this->field_0x258 >> 2 & 1) != 0) && (local_488->mtime != 0)) {
          iVar1 = local_488->mtime;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_498,"mtime");
          peVar7 = entry::operator[](peVar7,local_498);
          entry::operator=(peVar7,iVar1);
        }
        peVar7 = local_388;
        iVar1 = local_488->size;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_4a8,"length");
        peVar7 = entry::operator[](peVar7,_auStack_4a8);
        entry::operator=(peVar7,iVar1);
        local_4aa = (local_488->flags).m_val;
        uVar21 = (undefined7)((ulong)local_488 >> 8);
        local_4a9.m_val = local_4aa;
        anon_unknown_40::add_file_attrs
                  (local_388,(file_flags_t)local_4aa,(bool)((byte)this->field_0x258 >> 3 & 1));
        in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 (CONCAT71(uVar21,(byte)this->field_0x258 >> 3) & 0xffffffffffffff01);
        local_b01 = false;
        if ((char)in_RCX != '\0') {
          local_4ac = local_4a9.m_val;
          local_4ad = '\b';
          local_4ab = (bitfield_flag)
                      libtorrent::flags::operator&
                                (local_4a9,
                                 (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                 '\b');
          local_b01 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_4ab);
        }
        peVar7 = local_388;
        if (local_b01 != false) {
          ::std::__cxx11::string::string((string *)&local_4d0,(string *)&local_488->symlink);
          anon_unknown_40::add_symlink_path(peVar7,&local_4d0);
          ::std::__cxx11::string::~string((string *)&local_4d0);
        }
        bVar3 = ::std::
                vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                empty(&(this->m_filehashes).
                       super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     );
        if (!bVar3) {
          c_01 = ::std::
                 vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                 front(&(this->m_filehashes).
                        super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      );
          span<char_const>::span<libtorrent::digest32<160l>,char,void>
                    ((span<char_const> *)&local_4e0,c_01);
          peVar7 = local_388;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&files,"sha1");
          peVar7 = entry::operator[](peVar7,_files);
          entry::operator=(peVar7,local_4e0);
        }
      }
      else {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_2,"files");
        local_4f8 = entry::operator[](peVar7,___range3_2);
        ___end3_2 = file_range(this);
        local_51c = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                    ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                             *)&__end3_2);
        iVar4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                       *)&__end3_2);
        while( true ) {
          i = local_51c.m_idx.m_val;
          local_528 = iVar4.m_idx.m_val;
          bVar3 = libtorrent::operator!=(local_51c,iVar4);
          if (!bVar3) break;
          file_e._4_4_ = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         ::operator*(&local_51c);
          plVar14 = entry::list(local_4f8);
          ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                    (plVar14);
          plVar14 = entry::list(local_4f8);
          pvVar15 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::back
                              (plVar14);
          local_538 = pvVar15;
          if (((byte)this->field_0x258 >> 2 & 1) != 0) {
            local_53c = file_e._4_4_;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,file_e._4_4_);
            if (pvVar17->mtime != 0) {
              local_540 = file_e._4_4_;
              pvVar17 = libtorrent::aux::
                        container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                        ::operator[](&this->m_files,file_e._4_4_);
              pvVar2 = local_538;
              iVar1 = pvVar17->mtime;
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_550,"mtime");
              peVar7 = entry::operator[](pvVar2,local_550);
              entry::operator=(peVar7,iVar1);
            }
          }
          local_554 = file_e._4_4_;
          pvVar17 = libtorrent::aux::
                    container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                    ::operator[](&this->m_files,file_e._4_4_);
          pvVar2 = local_538;
          iVar1 = pvVar17->size;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path_e,"length");
          peVar7 = entry::operator[](pvVar2,_path_e);
          entry::operator=(peVar7,iVar1);
          pvVar2 = local_538;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&p_1.field_2 + 8),
                     "path");
          peVar7 = entry::operator[](pvVar2,stack0xfffffffffffffa80);
          path._M_str._4_4_ = file_e._4_4_;
          pvVar17 = libtorrent::aux::
                    container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                    ::operator[](&this->m_files,file_e._4_4_);
          ::std::__cxx11::string::string(local_5a0,(string *)pvVar17);
          auVar23 = ::std::__cxx11::string::operator_cast_to_basic_string_view(local_5a0);
          p_00._M_len = auVar23._8_8_;
          elems.second._M_str = auVar23._0_8_;
          p_00._M_str = (char *)pvVar15;
          lsplit_path(&local_5d8,(libtorrent *)elems.second._M_str,p_00);
          plStack_5b8 = (libtorrent *)local_5d8.second._M_len;
          path._M_len = (size_t)local_5d8.second._M_str;
          local_618 = (libtorrent *)local_5d8.second._M_len;
          pcStack_610 = local_5d8.second._M_str;
          p_01._M_str = (char *)pvVar15;
          p_01._M_len = (size_t)local_5d8.second._M_str;
          lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)local_608,(libtorrent *)local_5d8.second._M_len,p_01);
          while (bVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_608),
                ((bVar3 ^ 0xffU) & 1) != 0) {
            pvVar8 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                     entry::list(peVar7);
            ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      (pvVar8,(basic_string_view<char,_std::char_traits<char>_> *)local_608);
            pcStack_648 = elems.first._M_str;
            p_02._M_str = (char *)pvVar15;
            p_02._M_len = elems.second._M_len;
            lsplit_path(&local_638,(libtorrent *)elems.first._M_str,p_02);
            ::std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_608,&local_638);
          }
          ::std::__cxx11::string::~string(local_5a0);
          local_650 = file_e._4_4_;
          pvVar17 = libtorrent::aux::
                    container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                    ::operator[](&this->m_files,file_e._4_4_);
          local_651 = (pvVar17->flags).m_val;
          uVar21 = (undefined7)((ulong)pvVar17 >> 8);
          local_649.m_val = local_651;
          anon_unknown_40::add_file_attrs
                    (local_538,(file_flags_t)local_651,(bool)((byte)this->field_0x258 >> 3 & 1));
          uVar10 = CONCAT71(uVar21,(byte)this->field_0x258 >> 3) & 0xffffffffffffff01;
          local_bc1 = false;
          if ((char)uVar10 != '\0') {
            local_653 = local_649.m_val;
            local_654 = '\b';
            local_652 = (bitfield_flag)
                        libtorrent::flags::operator&
                                  (local_649,
                                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                   '\b');
            local_bc1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_652);
          }
          pvVar15 = local_538;
          if (local_bc1 != false) {
            local_67c = file_e._4_4_;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,file_e._4_4_);
            ::std::__cxx11::string::string((string *)&local_678,(string *)&pvVar17->symlink);
            anon_unknown_40::add_symlink_path(pvVar15,&local_678);
            ::std::__cxx11::string::~string((string *)&local_678);
          }
          bVar3 = ::std::
                  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                  empty(&(this->m_filehashes).
                         super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       );
          in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                   CONCAT71((int7)(uVar10 >> 8),bVar3);
          local_bd9 = false;
          if (!bVar3) {
            local_680 = file_e._4_4_;
            pvVar16 = libtorrent::aux::
                      container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                      ::operator[](&this->m_filehashes,file_e._4_4_);
            digest32<160L>::digest32(&local_694);
            local_bd9 = digest32<160L>::operator!=(pvVar16,&local_694);
          }
          if (local_bd9 != false) {
            local_6ac = file_e._4_4_;
            pvVar16 = libtorrent::aux::
                      container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                      ::operator[](&this->m_filehashes,file_e._4_4_);
            span<char_const>::span<libtorrent::digest32<160l>,char,void>
                      ((span<char_const> *)&local_6a8,pvVar16);
            pvVar15 = local_538;
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_6c0,"sha1");
            peVar7 = entry::operator[](pvVar15,local_6c0);
            entry::operator=(peVar7,local_6a8);
          }
          tree._4_4_ = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                       ::operator++(&local_51c);
        }
      }
    }
    peVar7 = local_388;
    if ((local_1d & 1) != 0) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_5,"file tree");
      local_6d0 = entry::operator[](peVar7,___range2_5);
      ___end2_5 = file_range(this);
      local_6f4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                  ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                           *)&__end2_5);
      iVar4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                     *)&__end2_5);
      while (iStack_700 = iVar4, bVar3 = libtorrent::operator!=(local_6f4,iVar4), peVar7 = local_388
            , bVar3) {
        file_e_ptr._4_4_ =
             index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::operator*(&local_6f4);
        local_704 = file_e_ptr._4_4_;
        pvVar17 = libtorrent::aux::
                  container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                  ::operator[](&this->m_files,file_e_ptr._4_4_);
        file_e_ptr._2_1_ = (pvVar17->flags).m_val;
        file_e_ptr._1_1_ = '\x01';
        local_705.m_val = file_e_ptr._2_1_;
        file_e_ptr._3_1_ =
             libtorrent::flags::operator&
                       (file_e_ptr._2_1_,
                        (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x01');
        bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                          ((bitfield_flag *)((long)&file_e_ptr + 3));
        if (!bVar3) {
          file_path.field_2._8_8_ = local_6d0;
          split.second._M_str._4_4_ = local_704.m_val;
          pvVar17 = libtorrent::aux::
                    container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                    ::operator[](&this->m_files,local_704);
          ::std::__cxx11::string::string((string *)local_738,(string *)pvVar17);
          if ((this->field_0x258 & 1) == 0) {
            ::std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)local_760,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_738,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_738);
          }
          else {
            auVar23 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)local_738);
            p_03._M_len = auVar23._8_8_;
            e.second._M_str = auVar23._0_8_;
            p_03._M_str = (char *)in_RCX;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_760,(libtorrent *)e.second._M_str,p_03);
          }
          local_7c0.
          super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
          .m_icont.
          super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
          .holder.root.super_node.right_ = (node_ptr)split.first._M_str;
          sStack_7a0 = split.second._M_len;
          p_04._M_str = (char *)in_RCX;
          p_04._M_len = split.second._M_len;
          lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)auStack_790,(libtorrent *)split.first._M_str,p_04);
          while (bVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                                   ((basic_string_view<char,_std::char_traits<char>_> *)auStack_790)
                , ((bVar3 ^ 0xffU) & 1) != 0) {
            local_7c0.
            super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
            .m_icont.
            super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            .holder.root.super_node.parent_ = (node_ptr)auStack_790;
            local_7c0.
            super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
            .m_icont.
            super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            .holder.root.super_node.left_ = (node_ptr)e.first._M_len;
            key._M_str = (char *)e.first._M_len;
            key._M_len = (size_t)auStack_790;
            file_path.field_2._8_8_ = (size_type)entry::operator[](file_path.field_2._8_8_,key);
            k = (key_type *)entry::dict_abi_cxx11_((entry *)file_path.field_2._8_8_);
            ::std::__cxx11::string::string((string *)(local_7e8 + 8));
            boost::container::dtl::
            tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
            ::find(&local_7c0,k);
            entry::dict_abi_cxx11_((entry *)file_path.field_2._8_8_);
            boost::container::dtl::
            tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
            ::end((tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                   *)local_7e8);
            bVar3 = boost::container::dtl::operator!=
                              ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                                *)&local_7c0,
                               (iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                                *)local_7e8);
            ::std::__cxx11::string::~string((string *)(local_7e8 + 8));
            if (bVar3) {
              local_7ec = torrent_inconsistent_files;
              libtorrent::aux::
              throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>(&local_7ec);
            }
            local_828 = e.first._M_str;
            sStack_820 = e.second._M_len;
            p_05._M_str = (char *)in_RCX;
            p_05._M_len = e.second._M_len;
            lsplit_path(&local_810,(libtorrent *)e.first._M_str,p_05);
            ::std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)auStack_790,&local_810);
          }
          ::std::__cxx11::string::~string((string *)local_738);
          this_03 = &entry::dict_abi_cxx11_((entry *)file_path.field_2._8_8_)->
                     super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
          ;
          bVar3 = boost::container::dtl::
                  tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                  ::empty(this_03);
          this_00 = file_path.field_2._8_8_;
          if (!bVar3) {
            file_e_1._4_4_ = 0xd5;
            libtorrent::aux::
            throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)((long)&file_e_1 + 4));
          }
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_848);
          peVar7 = entry::operator[]((entry *)this_00,local_848);
          local_838 = peVar7;
          if (((byte)this->field_0x258 >> 2 & 1) != 0) {
            local_84c = local_704.m_val;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,local_704);
            if (pvVar17->mtime != 0) {
              local_850 = local_704.m_val;
              pvVar17 = libtorrent::aux::
                        container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                        ::operator[](&this->m_files,local_704);
              peVar18 = local_838;
              iVar1 = pvVar17->mtime;
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_860,"mtime");
              peVar18 = entry::operator[](peVar18,local_860);
              entry::operator=(peVar18,iVar1);
            }
          }
          uVar21 = (undefined7)((ulong)peVar7 >> 8);
          local_861 = local_705.m_val;
          anon_unknown_40::add_file_attrs
                    (local_838,local_705,(bool)((byte)this->field_0x258 >> 3 & 1));
          in_RCX = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                   (CONCAT71(uVar21,(byte)this->field_0x258 >> 3) & 0xffffffffffffff01);
          local_ca9 = false;
          if ((char)in_RCX != '\0') {
            local_863 = local_705.m_val;
            local_864 = '\b';
            local_862 = (bitfield_flag)
                        libtorrent::flags::operator&
                                  ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                   local_705.m_val,
                                   (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                   '\b');
            local_ca9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_862);
          }
          peVar7 = local_838;
          if (local_ca9 == false) {
            local_890 = local_704.m_val;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,local_704);
            if (0 < pvVar17->size) {
              local_8a4 = local_704.m_val;
              pvVar19 = libtorrent::aux::
                        container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                        ::operator[]((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                      *)(pad_hash.m_number._M_elems + 6),local_704);
              span<char_const>::span<libtorrent::digest32<256l>,char,void>
                        ((span<char_const> *)&local_8a0,pvVar19);
              peVar7 = local_838;
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_8b8,"pieces root");
              peVar7 = entry::operator[](peVar7,local_8b8);
              entry::operator=(peVar7,local_8a0);
            }
            local_8bc = local_704.m_val;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,local_704);
            peVar7 = local_838;
            iVar1 = pvVar17->size;
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_8d0,"length");
            peVar7 = entry::operator[](peVar7,local_8d0);
            entry::operator=(peVar7,iVar1);
          }
          else {
            local_88c = local_704.m_val;
            pvVar17 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,local_704);
            ::std::__cxx11::string::string((string *)&local_888,(string *)&pvVar17->symlink);
            anon_unknown_40::add_symlink_path(peVar7,&local_888);
            ::std::__cxx11::string::~string((string *)&local_888);
          }
        }
        local_8d4.m_val =
             (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                  ::operator++(&local_6f4);
      }
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_8e8,"meta version");
      peVar7 = entry::operator[](peVar7,local_8e8);
      entry::operator=(peVar7,2);
    }
    peVar7 = local_388;
    iVar22 = this->m_piece_length;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&p_2,"piece length");
    peVar7 = entry::operator[](peVar7,_p_2);
    entry::operator=(peVar7,(long)iVar22);
    peVar7 = local_388;
    if ((local_1e & 1) != 0) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_6,"pieces");
      peVar7 = entry::operator[](peVar7,___range2_6);
      local_900 = entry::string_abi_cxx11_(peVar7);
      __end2_6 = ::std::
                 vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
                 begin(&(this->m_piece_hash).
                        super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      );
      h = (sha1_hash *)
          ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          end(&(this->m_piece_hash).
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             );
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_6,
                                (__normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                                 *)&h), bVar3) {
        this_04 = __gnu_cxx::
                  __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                  ::operator*(&__end2_6);
        psVar13 = local_900;
        pcVar20 = digest32<160L>::data(this_04);
        digest32<160L>::size();
        ::std::__cxx11::string::append((char *)psVar13,(ulong)pcVar20);
        __gnu_cxx::
        __normal_iterator<const_libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
        ::operator++(&__end2_6);
      }
    }
  }
  local_49 = 1;
  list_1._4_4_ = 1;
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::~container_wrapper
            ((container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
              *)(pad_hash.m_number._M_elems + 6));
  if ((local_49 & 1) == 0) {
    entry::~entry(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

entry create_torrent::generate() const
	{
		if (m_files.empty() || m_total_size == 0)
			aux::throw_ex<system_error>(errors::torrent_missing_file_tree);

		// if all v2 hashes are set correctly, generate the v2 parts of the
		// torrent
		bool const make_v2 = validate_v2_hashes(m_files, m_file_piece_hash, m_piece_length);
		bool const make_v1 = validate_v1_hashes(m_piece_hash, m_total_size, m_piece_length);

		// if neither v1 nor v2 hashes were set, we can't create a torrent
		if (!make_v1 && !make_v2)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		TORRENT_ASSERT(m_piece_length > 0);

		entry dict;

		if (!m_urls.empty()) dict["announce"] = m_urls.front().first;

		if (!m_nodes.empty())
		{
			entry& nodes = dict["nodes"];
			entry::list_type& nodes_list = nodes.list();
			for (auto const& n : m_nodes)
			{
				entry::list_type node(2);
				node[0] = n.first;
				node[1] = n.second;
				nodes_list.emplace_back(std::move(node));
			}
		}

		if (m_urls.size() > 1)
		{
			entry::list_type trackers;
			entry::list_type tier;
			int current_tier = m_urls.front().second;
			for (auto const& url : m_urls)
			{
				if (url.second != current_tier)
				{
					current_tier = url.second;
					trackers.emplace_back(std::move(tier));
					tier.clear();
				}
				tier.emplace_back(url.first);
			}
			trackers.emplace_back(std::move(tier));
			dict["announce-list"] = std::move(trackers);
		}

		if (!m_comment.empty())
			dict["comment"] = m_comment;

		if (m_creation_date != 0)
			dict["creation date"] = m_creation_date;

		if (!m_created_by.empty())
			dict["created by"] = m_created_by;

		if (!m_url_seeds.empty())
		{
			if (m_url_seeds.size() == 1)
			{
				dict["url-list"] = m_url_seeds.front();
			}
			else
			{
				entry& list = dict["url-list"];
				for (auto const& url : m_url_seeds)
				{
					list.list().emplace_back(url);
				}
			}
		}

		aux::vector<sha256_hash, file_index_t> fileroots;
		if (make_v2)
		{
			TORRENT_ASSERT(!m_file_piece_hash.empty());
			fileroots.resize(m_files.size());

			sha256_hash const pad_hash = merkle_pad(m_piece_length / default_block_size, 1);
			auto& file_pieces = dict["piece layers"].dict();

			for (file_index_t fi : file_range())
			{
				if (m_files[fi].flags & file_storage::flag_pad_file) continue;
				if (m_files[fi].size == 0) continue;

				fileroots[fi] = merkle_root(m_file_piece_hash[fi], pad_hash);

				// files that only have one piece store the piece hash as the
				// root, we don't need a pieces layer entry for such files
				if (m_file_piece_hash[fi].size() < 2) continue;
				auto& pieces = file_pieces[fileroots[fi].to_string()].string();
				pieces.clear();
				pieces.reserve(m_file_piece_hash[fi].size() * sha256_hash::size());
				for (auto const& p : m_file_piece_hash[fi])
					pieces.append(reinterpret_cast<const char*>(p.data()), p.size());
			}
		}

		entry& info = dict["info"];
#if TORRENT_ABI_VERSION < 4
		if (m_info_dict.type() == entry::dictionary_t
			|| m_info_dict.type() == entry::preformatted_t)
		{
			info = m_info_dict;
			return dict;
		}
#endif

		if (!m_collections.empty())
		{
			entry& list = info["collections"];
			for (auto const& c : m_collections)
			{
				list.list().emplace_back(c);
			}
		}

		if (!m_similar.empty())
		{
			entry& list = info["similar"];
			for (auto const& ih : m_similar)
			{
				list.list().emplace_back(ih);
			}
		}

		info["name"] = m_name;

		if (!m_root_cert.empty())
			info["ssl-cert"] = m_root_cert;

		if (m_private) info["private"] = 1;

		if (make_v1)
		{
			if (!m_multifile)
			{
				auto const& file = m_files.front();
				if (m_include_mtime && file.mtime)
					info["mtime"] = file.mtime;
				info["length"] = file.size;
				file_flags_t const flags = file.flags;
				add_file_attrs(info, flags, m_include_symlinks);
				if (m_include_symlinks
					&& (flags & file_storage::flag_symlink))
				{
					add_symlink_path(info, file.symlink);
				}
#if TORRENT_ABI_VERSION < 3
				if (!m_filehashes.empty())
				{
					info["sha1"] = m_filehashes.front();
				}
#endif
			}
			else
			{
				entry& files = info["files"];

				for (auto const i : file_range())
				{
					files.list().emplace_back();
					entry& file_e = files.list().back();
					if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;
					file_e["length"] = m_files[i].size;

					TORRENT_ASSERT(has_parent_path(m_files[i].filename));

					{
						entry& path_e = file_e["path"];

						std::string const p = m_files[i].filename;
						// deliberately skip the first path element, since that's the
						// "name" of the torrent already
						string_view path = lsplit_path(p).second;
						for (auto elems = lsplit_path(path); !elems.first.empty(); elems = lsplit_path(elems.second))
							path_e.list().emplace_back(elems.first);
					}

					file_flags_t const flags = m_files[i].flags;
					add_file_attrs(file_e, flags, m_include_symlinks);

					if (m_include_symlinks && (flags & file_storage::flag_symlink))
					{
						add_symlink_path(file_e, m_files[i].symlink);
					}
#if TORRENT_ABI_VERSION < 3
					if (!m_filehashes.empty() && m_filehashes[i] != sha1_hash())
					{
						file_e["sha1"] = m_filehashes[i];
					}
#endif
				}
			}
		}

		if (make_v2)
		{
			auto& tree = info["file tree"];

			for (file_index_t i : file_range())
			{
				file_flags_t const flags = m_files[i].flags;
				if (flags & file_storage::flag_pad_file) continue;

				entry* file_e_ptr = &tree;

				{
					std::string const file_path = m_files[i].filename;
					auto const split = m_multifile
						? lsplit_path(file_path)
						: std::pair<string_view, string_view>(file_path, file_path);
					TORRENT_ASSERT(split.first == m_name);

					for (auto e = lsplit_path(split.second);
						!e.first.empty();
						e = lsplit_path(e.second))
					{
						file_e_ptr = &(*file_e_ptr)[e.first];
						if (file_e_ptr->dict().find({}) != file_e_ptr->dict().end())
						{
							// path conflict
							// there is already a file with this name
							// refuse to generate a torrent with such a conflict
							aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
						}
					}
				}

				if (!file_e_ptr->dict().empty())
				{
					// path conflict
					// there is already a directory with this name
					// refuse to generate a torrent with such a conflict
					aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
				}

				entry& file_e = (*file_e_ptr)[{}];

				if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;

				add_file_attrs(file_e, flags, m_include_symlinks);

				if (m_include_symlinks && (flags & file_storage::flag_symlink))
				{
					add_symlink_path(file_e, m_files[i].symlink);
				}
				else
				{
					if (m_files[i].size > 0)
						file_e["pieces root"] = fileroots[i];
					file_e["length"] = m_files[i].size;
				}
			}
			info["meta version"] = 2;
		}

		info["piece length"] = m_piece_length;

		if (make_v1)
		{
			std::string& p = info["pieces"].string();

			for (sha1_hash const& h : m_piece_hash)
				p.append(h.data(), h.size());
		}

		return dict;
	}